

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O0

panel * get_panel_combat(void)

{
  int iVar1;
  ulong uVar2;
  wchar_t wVar3;
  panel *p_00;
  object *poVar4;
  uint local_2c;
  uint local_28;
  wchar_t melee_sides;
  wchar_t melee_dice;
  wchar_t hit;
  wchar_t dam;
  wchar_t bth;
  object *obj;
  panel *p;
  
  p_00 = panel_allocate(L'\t');
  local_28 = 1;
  local_2c = 1;
  panel_line(p_00,'\x0e',"Armor","[%d,%+d]",(ulong)(uint)(player->known_state).ac,
             (ulong)(uint)(player->known_state).to_a);
  poVar4 = equipped_item_by_slot_name(player,"weapon");
  iVar1 = (player->state).skills[6];
  melee_dice = (player->known_state).to_d;
  melee_sides = (player->known_state).to_h;
  if ((poVar4 != (object *)0x0) && (poVar4->known != (object *)0x0)) {
    local_28 = (uint)poVar4->known->dd;
    local_2c = (uint)poVar4->known->ds;
    wVar3 = object_to_dam(poVar4->known);
    melee_dice = wVar3 + melee_dice;
    wVar3 = object_to_hit(poVar4->known);
    melee_sides = wVar3 + melee_sides;
  }
  if (((player->known_state).bless_wield & 1U) != 0) {
    melee_sides = melee_sides + L'\x02';
  }
  panel_space(p_00);
  panel_line(p_00,'\x0e',"Melee","%dd%d,%+d",(ulong)local_28,(ulong)local_2c,melee_dice);
  panel_line(p_00,'\x0e',"To-hit","%d,%+d",(long)((iVar1 * 10) / 3) / 10 & 0xffffffff,
             (ulong)(uint)melee_sides);
  uVar2 = (long)(player->state).num_blows / 10;
  panel_line(p_00,'\x0e',"Blows","%d.%d/turn",(long)(player->state).num_blows / 100 & 0xffffffff,
             (long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) % 10 &
             0xffffffff);
  poVar4 = equipped_item_by_slot_name(player,"shooting");
  iVar1 = (player->state).skills[7];
  melee_dice = L'\0';
  melee_sides = (player->known_state).to_h;
  if ((poVar4 != (object *)0x0) && (poVar4->known != (object *)0x0)) {
    melee_dice = object_to_dam(poVar4->known);
    wVar3 = object_to_hit(poVar4->known);
    melee_sides = wVar3 + melee_sides;
  }
  panel_space(p_00);
  panel_line(p_00,'\x0e',"Shoot to-dam","%+d",(ulong)(uint)melee_dice);
  panel_line(p_00,'\x0e',"To-hit","%d,%+d",(long)((iVar1 * 10) / 3) / 10 & 0xffffffff,
             (ulong)(uint)melee_sides);
  panel_line(p_00,'\x0e',"Shots","%d.%d/turn",(long)(player->state).num_shots / 10 & 0xffffffff,
             (long)(player->state).num_shots % 10 & 0xffffffff);
  return p_00;
}

Assistant:

static struct panel *get_panel_combat(void) {
	struct panel *p = panel_allocate(9);
	struct object *obj;
	int bth, dam, hit;
	int melee_dice = 1, melee_sides = 1;

	/* AC */
	panel_line(p, COLOUR_L_BLUE, "Armor", "[%d,%+d]",
			player->known_state.ac, player->known_state.to_a);

	/* Melee */
	obj = equipped_item_by_slot_name(player, "weapon");
	bth = (player->state.skills[SKILL_TO_HIT_MELEE] * 10) / BTH_PLUS_ADJ;
	dam = player->known_state.to_d;
	hit = player->known_state.to_h;
	if (obj && obj->known) {
		melee_dice = obj->known->dd;
		melee_sides = obj->known->ds;
		dam += object_to_dam(obj->known);
		hit += object_to_hit(obj->known);
	}
	if (player->known_state.bless_wield) {
		hit += 2;
	}

	panel_space(p);
	panel_line(p, COLOUR_L_BLUE, "Melee", "%dd%d,%+d", melee_dice, melee_sides, dam);
	panel_line(p, COLOUR_L_BLUE, "To-hit", "%d,%+d", bth / 10, hit);
	panel_line(p, COLOUR_L_BLUE, "Blows", "%d.%d/turn",
			player->state.num_blows / 100, (player->state.num_blows / 10 % 10));

	/* Ranged */
	obj = equipped_item_by_slot_name(player, "shooting");
	bth = (player->state.skills[SKILL_TO_HIT_BOW] * 10) / BTH_PLUS_ADJ;
	dam = 0;
	hit = player->known_state.to_h;
	if (obj && obj->known) {
		dam += object_to_dam(obj->known);
		hit += object_to_hit(obj->known);
	}

	panel_space(p);
	panel_line(p, COLOUR_L_BLUE, "Shoot to-dam", "%+d", dam);
	panel_line(p, COLOUR_L_BLUE, "To-hit", "%d,%+d", bth / 10, hit);
	panel_line(p, COLOUR_L_BLUE, "Shots", "%d.%d/turn",
			   player->state.num_shots / 10, player->state.num_shots % 10);

	return p;
}